

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O3

cmSourceGroup * __thiscall cmSourceGroup::LookupChild(cmSourceGroup *this,char *name)

{
  cmSourceGroup *pcVar1;
  int iVar2;
  cmSourceGroup *pcVar3;
  string sgName;
  allocator local_51;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar3 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar3 != pcVar1) {
    do {
      std::__cxx11::string::string((string *)local_50,(pcVar3->Name)._M_dataplus._M_p,&local_51);
      iVar2 = std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (iVar2 == 0) {
        return pcVar3;
      }
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != pcVar1);
  }
  return (cmSourceGroup *)0x0;
}

Assistant:

cmSourceGroup *cmSourceGroup::LookupChild(const char* name) const
{
  // initializing iterators
  std::vector<cmSourceGroup>::const_iterator iter =
    this->Internal->GroupChildren.begin();
  const std::vector<cmSourceGroup>::const_iterator end =
    this->Internal->GroupChildren.end();

  // st
  for(;iter!=end; ++iter)
    {
    std::string sgName = iter->GetName();

    // look if descenened is the one were looking for
    if(sgName == name)
      {
      return const_cast<cmSourceGroup*>(&(*iter)); // if it so return it
      }
    }

  // if no child with this name was found return NULL
  return NULL;
}